

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O1

BOOL MakePixelWaveData(PIXTONEPARAMETER *ptp,uchar *pData)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  char envelopeTable [256];
  char local_128 [264];
  
  MakeWaveTables();
  uVar11 = 0;
  memset(local_128,0,0x100);
  iVar2 = ptp->pointAx;
  if (0 < (long)iVar2) {
    dVar12 = (double)ptp->initial;
    dVar13 = (double)ptp->pointAy - dVar12;
    uVar11 = 0;
    do {
      local_128[uVar11] = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)iVar2;
      uVar11 = uVar11 + 1;
    } while ((long)iVar2 != uVar11);
  }
  uVar9 = ptp->pointBx;
  if ((int)uVar11 < (int)uVar9) {
    dVar12 = (double)ptp->pointAy;
    dVar13 = (double)ptp->pointBy - dVar12;
    uVar11 = uVar11 & 0xffffffff;
    do {
      local_128[uVar11] = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)(int)(uVar9 - iVar2);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  iVar2 = ptp->pointCx;
  uVar10 = (uint)uVar11;
  if ((int)uVar10 < iVar2) {
    dVar12 = (double)ptp->pointBy;
    dVar13 = (double)ptp->pointCy - dVar12;
    pcVar3 = local_128 + (uVar11 & 0xffffffff);
    do {
      *pcVar3 = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)(int)(iVar2 - uVar9);
      pcVar3 = pcVar3 + 1;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while ((int)uVar10 < iVar2);
  }
  if (uVar10 < 0x100) {
    dVar12 = (double)ptp->pointCy;
    dVar13 = dVar12 / (double)(0x100 - iVar2);
    uVar11 = (ulong)uVar10;
    do {
      uVar4 = uVar11 + 1;
      local_128[uVar11] = (char)(int)dVar12;
      dVar12 = dVar12 - dVar13;
      uVar11 = uVar4;
    } while ((int)uVar4 != 0x100);
  }
  dVar12 = (ptp->oMain).num;
  dVar13 = 0.0;
  dVar14 = 0.0;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar14 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (ptp->oPitch).num;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar13 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (ptp->oVolume).num;
  dVar15 = 0.0;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar15 = 256.0 / ((double)ptp->size / dVar12);
  }
  uVar11 = (ulong)(uint)ptp->size;
  if (0 < ptp->size) {
    dVar12 = (double)(ptp->oPitch).offset;
    dVar16 = (double)(ptp->oMain).offset;
    dVar17 = (double)(ptp->oVolume).offset;
    iVar2 = 0;
    lVar6 = 0;
    do {
      iVar7 = (int)gWaveModelTable[(ptp->oMain).model][(int)dVar16 % 0x100] * (ptp->oMain).top;
      iVar5 = iVar7 + 0x3f;
      if (-1 < iVar7) {
        iVar5 = iVar7;
      }
      iVar8 = (int)gWaveModelTable[(ptp->oVolume).model][(int)dVar17 % 0x100] * (ptp->oVolume).top;
      iVar7 = iVar8 + 0x3f;
      if (-1 < iVar8) {
        iVar7 = iVar8;
      }
      iVar7 = ((iVar7 >> 6) + 0x40) * (iVar5 >> 6);
      iVar5 = iVar7 + 0x3f;
      if (-1 < iVar7) {
        iVar5 = iVar7;
      }
      uVar10 = (int)local_128[(int)((double)iVar2 / (double)(int)uVar11)] * (iVar5 >> 6);
      uVar9 = uVar10 + 0x3f;
      if (-1 < (int)uVar10) {
        uVar9 = uVar10;
      }
      pData[lVar6] = (char)(uVar9 >> 6) + 0x80;
      cVar1 = gWaveModelTable[(ptp->oPitch).model][(int)dVar12 % 0x100];
      if (cVar1 < '\0') {
        dVar18 = dVar14 - (double)(ptp->oPitch).top * (double)-(int)cVar1 * dVar14 * 0.5 * 0.015625
                          * 0.015625;
      }
      else {
        dVar18 = (double)(ptp->oPitch).top * (double)(int)cVar1 * (dVar14 + dVar14) * 0.015625 *
                 0.015625 + dVar14;
      }
      dVar16 = dVar16 + dVar18;
      dVar12 = dVar12 + dVar13;
      dVar17 = dVar17 + dVar15;
      lVar6 = lVar6 + 1;
      uVar11 = (ulong)ptp->size;
      iVar2 = iVar2 + 0x100;
    } while (lVar6 < (long)uVar11);
  }
  return true;
}

Assistant:

BOOL MakePixelWaveData(const PIXTONEPARAMETER *ptp, unsigned char *pData)
{
	int i;
	int a, b, c, d;

	double dPitch;
	double dMain;
	double dVolume;

	double dEnvelope;
	signed char envelopeTable[0x100];

	double d1, d2, d3;

	// The Linux port added a cute optimisation here, where MakeWaveTables is only called once during the game's execution
	//if (wave_tables_made != TRUE)
	//{
		MakeWaveTables();
	//	wave_tables_made = TRUE;
	//}

	memset(envelopeTable, 0, sizeof(envelopeTable));

	i = 0;

	dEnvelope = ptp->initial;
	while (i < ptp->pointAx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointAy - ptp->initial) / ptp->pointAx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointAy;
	while (i < ptp->pointBx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointBy - ptp->pointAy) / (double)(ptp->pointBx - ptp->pointAx)) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointBy;
	while (i < ptp->pointCx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = ((double)ptp->pointCy - ptp->pointBy) / (double)(ptp->pointCx - ptp->pointBx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointCy;
	while (i < 0x100)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = dEnvelope - (ptp->pointCy / (double)(0x100 - ptp->pointCx));
		++i;
	}

	dPitch = ptp->oPitch.offset;
	dMain = ptp->oMain.offset;
	dVolume = ptp->oVolume.offset;

	if (ptp->oMain.num == 0.0)
		d1 = 0.0;
	else
		d1 = 256.0 / (ptp->size / ptp->oMain.num);

	if (ptp->oPitch.num == 0.0)
		d2 = 0.0;
	else
		d2 = 256.0 / (ptp->size / ptp->oPitch.num);

	if (ptp->oVolume.num == 0.0)
		d3 = 0.0;
	else
		d3 = 256.0 / (ptp->size / ptp->oVolume.num);

	for (i = 0; i < ptp->size; ++i)
	{
		a = (int)dMain % 0x100;
		b = (int)dPitch % 0x100;
		c = (int)dVolume % 0x100;
		d = (int)((double)(i * 0x100) / ptp->size);
		pData[i] = gWaveModelTable[ptp->oMain.model][a]
		         * ptp->oMain.top
		         / 64
		         * (((gWaveModelTable[ptp->oVolume.model][c] * ptp->oVolume.top) / 64) + 64)
		         / 64
		         * envelopeTable[d]
		         / 64
		         + 128;

		if (gWaveModelTable[ptp->oPitch.model][b] < 0)
			dMain = d1 - d1 * 0.5 * -gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;
		else
			dMain = d1 + d1 * 2.0 * gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;

		dPitch = dPitch + d2;
		dVolume = dVolume + d3;
	}

	return TRUE;
}